

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mksheet.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  pointer filename;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  size_type sVar7;
  reference pvVar8;
  reference src;
  vector<color_t,_std::allocator<color_t>_> *this;
  color_t *data;
  int local_c4;
  value_type *image;
  undefined1 local_a0 [4];
  int i;
  Image atlas;
  int spritesheet_height;
  int spritesheet_width;
  allocator<char> local_61;
  string local_60;
  undefined1 local_40 [8];
  vector<Image,_std::allocator<Image>_> images;
  char *out_filename;
  char *in_filename;
  char **argv_local;
  int argc_local;
  
  if ((argc == 0) || (2 < argc)) {
    __s = argv[1];
    images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,__s,&local_61);
    LoadSpritesheet((vector<Image,_std::allocator<Image>_> *)local_40,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    sVar7 = std::vector<Image,_std::allocator<Image>_>::size
                      ((vector<Image,_std::allocator<Image>_> *)local_40);
    if (sVar7 % 10 == 0) {
      sVar7 = std::vector<Image,_std::allocator<Image>_>::size
                        ((vector<Image,_std::allocator<Image>_> *)local_40);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = sVar7;
      local_c4 = SUB164(auVar1 / ZEXT816(10),0);
    }
    else {
      sVar7 = std::vector<Image,_std::allocator<Image>_>::size
                        ((vector<Image,_std::allocator<Image>_> *)local_40);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = sVar7;
      local_c4 = SUB164(auVar2 / ZEXT816(10),0) + 1;
    }
    atlas.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = local_c4;
    pvVar8 = std::vector<Image,_std::allocator<Image>_>::operator[]
                       ((vector<Image,_std::allocator<Image>_> *)local_40,0);
    iVar3 = Image::GetWidth(pvVar8);
    pvVar8 = std::vector<Image,_std::allocator<Image>_>::operator[]
                       ((vector<Image,_std::allocator<Image>_> *)local_40,0);
    iVar4 = Image::GetHeight(pvVar8);
    Image::Image((Image *)local_a0,iVar3 * 10,
                 iVar4 * atlas.pixels_.super__Vector_base<color_t,_std::allocator<color_t>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage._4_4_);
    for (image._4_4_ = 0;
        sVar7 = std::vector<Image,_std::allocator<Image>_>::size
                          ((vector<Image,_std::allocator<Image>_> *)local_40),
        filename = images.super__Vector_base<Image,_std::allocator<Image>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage, (ulong)(long)image._4_4_ < sVar7;
        image._4_4_ = image._4_4_ + 1) {
      pvVar8 = std::vector<Image,_std::allocator<Image>_>::operator[]
                         ((vector<Image,_std::allocator<Image>_> *)local_40,(long)image._4_4_);
      src = std::vector<Image,_std::allocator<Image>_>::operator[]
                      ((vector<Image,_std::allocator<Image>_> *)local_40,(long)image._4_4_);
      iVar3 = Image::GetWidth(pvVar8);
      iVar4 = Image::GetHeight(pvVar8);
      Image::Blit((Image *)local_a0,src,(image._4_4_ % 10) * iVar3,(image._4_4_ / 10) * iVar4);
    }
    iVar3 = Image::GetWidth((Image *)local_a0);
    iVar4 = Image::GetHeight((Image *)local_a0);
    this = Image::GetData((Image *)local_a0);
    data = std::vector<color_t,_std::allocator<color_t>_>::data(this);
    iVar5 = Image::GetWidth((Image *)local_a0);
    stbi_write_png((char *)filename,iVar3,iVar4,3,data,iVar5 * 3);
    argv_local._4_4_ = 0;
    Image::~Image((Image *)local_a0);
    std::vector<Image,_std::allocator<Image>_>::~vector
              ((vector<Image,_std::allocator<Image>_> *)local_40);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar6 = std::operator<<(poVar6,*argv);
    std::operator<<(poVar6," in.pic out.png\n");
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv) {
  if (argc)

    if (argc < 3) {
      std::cerr << "Usage: " << argv[0] << " in.pic out.png\n";
      return 1;
    }

  auto const in_filename = argv[1];
  auto const out_filename = argv[2];

  auto images = LoadSpritesheet(in_filename);

  auto const spritesheet_width = 10;
  auto const spritesheet_height = images.size() % 10 == 0
                                      ? (int)(images.size() / 10)
                                      : (int)(images.size() / 10) + 1;
  auto atlas = Image{images[0].GetWidth() * spritesheet_width,
                     images[0].GetHeight() * spritesheet_height};

  for (auto i = 0; i < images.size(); ++i) {
    auto& image = images[i];
    atlas.Blit(images[i], (i % spritesheet_width) * image.GetWidth(),
               (i / spritesheet_width) * image.GetHeight());
  }

  // XXX: I'm relying on color_t to serialize properly without
  // intervention which may not be the case on non-x86 platforms
  stbi_write_png(out_filename, atlas.GetWidth(), atlas.GetHeight(),
                 kImageComponents, atlas.GetData().data(),
                 atlas.GetWidth() * kImageComponents);

  return 0;
}